

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DoFilter2_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh)

{
  ulong uVar1;
  ulong *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  __m128i q1s;
  __m128i p1s;
  __m128i sign_bit;
  __m128i mask;
  __m128i a;
  ulong local_188;
  ulong uVar2;
  ulong uVar3;
  __m128i *in_stack_fffffffffffffea8;
  __m128i *in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  ulong in_stack_fffffffffffffec0;
  
  uVar2 = 0x8080808080808080;
  uVar3 = 0x8080808080808080;
  local_188 = *in_RCX ^ 0x8080808080808080;
  NeedsFilter_SSE2(in_stack_fffffffffffffea8,(__m128i *)0x8080808080808080,
                   (__m128i *)0x8080808080808080,(__m128i *)(in_RDI[1] ^ 0x8080808080808080),
                   (uint)((ulong)*in_RDI >> 0x20) ^ 0x80808080,
                   (__m128i *)(in_RCX[1] ^ 0x8080808080808080));
  uVar1 = (*in_RSI)[1];
  (*in_RSI)[0] = (*in_RSI)[0] ^ uVar2;
  (*in_RSI)[1] = uVar1 ^ uVar3;
  uVar1 = (*in_RDX)[1];
  (*in_RDX)[0] = (*in_RDX)[0] ^ uVar2;
  (*in_RDX)[1] = uVar1 ^ uVar3;
  GetBaseDelta_SSE2((__m128i *)&stack0xfffffffffffffe88,in_RSI,in_RDX,(__m128i *)&local_188,
                    (__m128i *)&stack0xfffffffffffffeb8);
  DoSimpleFilter_SSE2((__m128i *)(in_stack_fffffffffffffec0 & (ulong)in_stack_fffffffffffffeb0),
                      (__m128i *)(in_stack_fffffffffffffeb8 & (ulong)in_stack_fffffffffffffea8),
                      in_stack_fffffffffffffeb0);
  uVar1 = (*in_RSI)[1];
  (*in_RSI)[0] = (*in_RSI)[0] ^ uVar2;
  (*in_RSI)[1] = uVar1 ^ uVar3;
  uVar1 = (*in_RDX)[1];
  (*in_RDX)[0] = (*in_RDX)[0] ^ uVar2;
  (*in_RDX)[1] = uVar1 ^ uVar3;
  return;
}

Assistant:

static WEBP_INLINE void DoFilter2_SSE2(__m128i* const p1, __m128i* const p0,
                                       __m128i* const q0, __m128i* const q1,
                                       int thresh) {
  __m128i a, mask;
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  // convert p1/q1 to int8_t (for GetBaseDelta_SSE2)
  const __m128i p1s = _mm_xor_si128(*p1, sign_bit);
  const __m128i q1s = _mm_xor_si128(*q1, sign_bit);

  NeedsFilter_SSE2(p1, p0, q0, q1, thresh, &mask);

  FLIP_SIGN_BIT2(*p0, *q0);
  GetBaseDelta_SSE2(&p1s, p0, q0, &q1s, &a);
  a = _mm_and_si128(a, mask);     // mask filter values we don't care about
  DoSimpleFilter_SSE2(p0, q0, &a);
  FLIP_SIGN_BIT2(*p0, *q0);
}